

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.cpp
# Opt level: O0

SDKJsonResult * __thiscall tonk::SDKSocket::Create(SDKSocket *this)

{
  TonkResult TVar1;
  TonkSocketConfig *in_RSI;
  SDKSocket *in_RDI;
  TonkResult result;
  TonkJson json;
  TonkSocketConfig config;
  SDKJsonResult *error;
  TonkJson *in_stack_fffffffffffffb38;
  SDKSocket *this_00;
  char local_48b [1024];
  __2 local_8b;
  __1 local_8a;
  __0 local_89;
  undefined4 local_88 [20];
  _func_uint32_t_TonkAppContextPtr_TonkConnection_TonkAddress_ptr_TonkConnectionConfig_ptr *local_38
  ;
  _func_uint32_t_TonkAppContextPtr_TonkConnection_TonkAddress_ptr_TonkConnectionConfig_ptr *local_30
  ;
  _func_void_TonkAppContextPtr_TonkSocket_char_ptr_uint16_t_uint8_t_ptr_uint32_t *local_28;
  
  this_00 = in_RDI;
  BlockingDestroy(in_RDI);
  memcpy(local_88,&in_RSI->AppContextPtr,0x78);
  local_88[0] = 9;
  local_30 = Create()::$_0::operator_cast_to_function_pointer(&local_89);
  local_38 = Create()::$_1::operator_cast_to_function_pointer(&local_8a);
  local_28 = Create()::$_2::operator_cast_to_function_pointer(&local_8b);
  TVar1 = tonk_socket_create(in_RSI,(TonkSocket *)this_00,in_stack_fffffffffffffb38);
  SDKJsonResult::SDKJsonResult((SDKJsonResult *)this_00);
  if (TVar1 != Tonk_Success) {
    *(TonkResult *)&in_RDI->_vptr_SDKSocket = TVar1;
    std::__cxx11::string::operator=((string *)&in_RDI->Config,local_48b);
  }
  return (SDKJsonResult *)this_00;
}

Assistant:

SDKJsonResult SDKSocket::Create()
{
    BlockingDestroy();

    TonkSocketConfig config = Config;

    // Override the following members:
    config.AppContextPtr = reinterpret_cast<TonkAppContextPtr>(this);
    config.Version = TONK_VERSION;
    config.OnP2PConnectionStart = [](
        TonkAppContextPtr context,
        TonkConnection connection,
        const TonkAddress* address,
        TonkConnectionConfig* configOut) -> uint32_t
    {
        SDKSocket* thiz = (SDKSocket*)context;
        SDKConnection* sdkConnection = thiz->OnP2PConnectionStart(*address);
        if (!sdkConnection) {
            return TONK_DENY_CONNECTION;
        }

        sdkConnection->MyConnection = connection;
        // Hold a self-reference if connection is started
        sdkConnection->SetSelfReference();

        *configOut = MakeConnectionConfig(sdkConnection);
        return TONK_ACCEPT_CONNECTION;
    };
    config.OnIncomingConnection = [](
        TonkAppContextPtr context,
        TonkConnection connection,
        const TonkAddress* address,
        TonkConnectionConfig* configOut) -> uint32_t
    {
        SDKSocket* thiz = (SDKSocket*)context;
        SDKConnection* sdkConnection = thiz->OnIncomingConnection(*address);
        if (!sdkConnection) {
            return TONK_DENY_CONNECTION;
        }

        sdkConnection->MyConnection = connection;
        // Hold a self-reference if connection is started
        sdkConnection->SelfReference = sdkConnection->shared_from_this();

        *configOut = MakeConnectionConfig(sdkConnection);
        return TONK_ACCEPT_CONNECTION;
    };
    config.OnAdvertisement = [](
        TonkAppContextPtr context,
        TonkSocket /*tonkSocket*/,
        const char* ipString,
        uint16_t port,
        uint8_t* data,
        uint32_t bytes)
    {
        SDKSocket* thiz = (SDKSocket*)context;
        thiz->OnAdvertisement(ipString, port, data, bytes);
    };

    TonkJson json;
    TonkResult result = tonk_socket_create(&config, &MySocket, &json);

    SDKJsonResult error;
    if (TONK_FAILED(result))
    {
        error.Result = result;
        error.ErrorJson = json.JsonString;
    }
    return error;
}